

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_crt.c
# Opt level: O1

int x509_write_time(uchar **p,uchar *start,char *time,size_t size)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uchar tag;
  
  if (((*time == '2') && (time[1] == '0')) && (time[2] < '5')) {
    uVar1 = mbedtls_asn1_write_raw_buffer(p,start,(uchar *)(time + 2),0xd);
    if ((int)uVar1 < 0) {
      return uVar1;
    }
    iVar2 = mbedtls_asn1_write_len(p,start,(ulong)uVar1);
    if (iVar2 < 0) {
      return iVar2;
    }
    tag = '\x17';
  }
  else {
    uVar1 = mbedtls_asn1_write_raw_buffer(p,start,(uchar *)time,0xf);
    if ((int)uVar1 < 0) {
      return uVar1;
    }
    iVar2 = mbedtls_asn1_write_len(p,start,(ulong)uVar1);
    if (iVar2 < 0) {
      return iVar2;
    }
    tag = '\x18';
  }
  iVar3 = mbedtls_asn1_write_tag(p,start,tag);
  if (-1 < iVar3) {
    iVar3 = iVar2 + uVar1 + iVar3;
  }
  return iVar3;
}

Assistant:

static int x509_write_time( unsigned char **p, unsigned char *start,
                            const char *time, size_t size )
{
    int ret;
    size_t len = 0;

    /*
     * write MBEDTLS_ASN1_UTC_TIME if year < 2050 (2 bytes shorter)
     */
    if( time[0] == '2' && time[1] == '0' && time [2] < '5' )
    {
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_raw_buffer( p, start,
                                             (const unsigned char *) time + 2,
                                             size - 2 ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_UTC_TIME ) );
    }
    else
    {
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_raw_buffer( p, start,
                                                  (const unsigned char *) time,
                                                  size ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_GENERALIZED_TIME ) );
    }

    return( (int) len );
}